

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O2

parser_error parse_quest_race(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *name;
  monster_race *pmVar3;
  
  pvVar2 = parser_priv(p);
  name = parser_getstr(p,"race");
  if (pvVar2 != (void *)0x0) {
    pmVar3 = lookup_monster(name);
    *(monster_race **)((long)pvVar2 + 0x20) = pmVar3;
    pVar1 = PARSE_ERROR_INVALID_MONSTER;
    if (pmVar3 != (monster_race *)0x0) {
      pVar1 = PARSE_ERROR_NONE;
    }
    return pVar1;
  }
  __assert_fail("q",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-quest.c"
                ,0x3b,"enum parser_error parse_quest_race(struct parser *)");
}

Assistant:

static enum parser_error parse_quest_race(struct parser *p) {
	struct quest *q = parser_priv(p);
	const char *name = parser_getstr(p, "race");
	assert(q);

	q->race = lookup_monster(name);
	if (!q->race)
		return PARSE_ERROR_INVALID_MONSTER;

	return PARSE_ERROR_NONE;
}